

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* unicode_regex_split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *__return_storage_ptr__,string *text,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *regex_exprs)

{
  char cVar1;
  pointer pbVar2;
  pointer pcVar3;
  unsigned_long uVar4;
  char *pcVar5;
  char *pcVar6;
  short sVar7;
  pointer puVar8;
  pointer puVar9;
  undefined8 uVar10;
  byte bVar11;
  bool bVar12;
  unicode_cpt_flags uVar13;
  int iVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  _Rb_tree_node_base *p_Var20;
  undefined6 extraout_var;
  const_iterator cVar21;
  mapped_type_conflict1 *pmVar22;
  mapped_type *pmVar23;
  pointer psVar24;
  ulong uVar25;
  runtime_error *this;
  uint uVar26;
  _Base_ptr p_Var27;
  uint uVar28;
  _Base_ptr p_Var29;
  long lVar30;
  wchar_t *pwVar31;
  wchar_t *pwVar32;
  _Alloc_hider _Var33;
  size_t offset_ini;
  wchar_t *pwVar34;
  ulong uVar35;
  pointer puVar36;
  ulong uVar37;
  string *psVar38;
  string *psVar39;
  pointer pbVar40;
  wchar_t *pwVar41;
  char *pcVar42;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *regex_expr;
  ulong uVar43;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar44;
  long *plVar45;
  ulong uVar46;
  initializer_list<unsigned_long> __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  __l_00;
  initializer_list<std::pair<const_int,_int>_> __l_01;
  initializer_list<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bpe_offsets;
  size_t len;
  cmatch match;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bpe_words;
  vector<unsigned_int,_std::allocator<unsigned_int>_> cpts;
  vector<unsigned_int,_std::allocator<unsigned_int>_> cpts_regex;
  vector<unsigned_int,_std::allocator<unsigned_int>_> cpts_1;
  string text_collapsed;
  uint8_t in_stack_fffffffffffffd7f;
  ulong local_280;
  undefined1 local_278 [32];
  pointer local_258;
  pointer psStack_250;
  pointer local_248;
  wchar_t *pwStack_240;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_238;
  regex_type local_220;
  wchar_t *local_200;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1f8;
  pointer local_1e0;
  string *local_1d8;
  vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  local_1d0;
  char *local_1b8;
  wchar_t *local_1b0;
  wide_string local_1a8;
  unsigned_long local_180;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_178;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_160;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_140;
  undefined1 local_138 [24];
  undefined1 auStack_120 [16];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_110;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_98;
  string *local_70;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  pointer local_48;
  wchar_t *local_40;
  wchar_t *local_38;
  
  local_140 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              __return_storage_ptr__;
  local_70 = text;
  if ((unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::k_ucat_enum_abi_cxx11_ == '\0') &&
     (iVar14 = __cxa_guard_acquire(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                    ::k_ucat_enum_abi_cxx11_), iVar14 != 0)) {
    local_278._0_4_ = 2;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<const_char_(&)[6],_unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *)local_138,(char (*) [6])"\\p{N}",(anon_enum_32 *)local_278);
    local_220._M_flags = 4;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<const_char_(&)[6],_unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_true>
              (&local_110,(char (*) [6])"\\p{L}",&local_220._M_flags);
    local_1d0.
    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_1d0.
                           super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0x20);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<const_char_(&)[6],_unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_true>
              (&local_e8,(char (*) [6])"\\p{P}",(anon_enum_32 *)&local_1d0);
    local_68 = (undefined1 *)CONCAT44(local_68._4_4_,0x10);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<const_char_(&)[6],_unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_true>
              (&local_c0,(char (*) [6])"\\p{M}",(anon_enum_32 *)&local_68);
    local_1a8._M_dataplus._M_p._0_4_ = 0x40;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<const_char_(&)[6],_unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_true>
              (&local_98,(char (*) [6])"\\p{S}",(anon_enum_32 *)&local_1a8);
    __l_00._M_len = 5;
    __l_00._M_array = (iterator)local_138;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::map(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
           ::k_ucat_enum_abi_cxx11_,__l_00,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          &local_160,(allocator_type *)&local_178);
    lVar19 = -200;
    paVar44 = &local_98.first.field_2;
    do {
      if (paVar44 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar44->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar44->_M_allocated_capacity)[-2],
                        paVar44->_M_allocated_capacity + 1);
      }
      paVar44 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar44->_M_allocated_capacity + -5);
      lVar19 = lVar19 + 0x28;
    } while (lVar19 != 0);
    __cxa_atexit(std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::~map,&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::k_ucat_enum_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::k_ucat_enum_abi_cxx11_);
  }
  if ((unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::k_ucat_cpt == '\0') &&
     (iVar14 = __cxa_guard_acquire(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                    ::k_ucat_cpt), iVar14 != 0)) {
    local_138._16_8_ = (pointer)0xd300000020;
    auStack_120._0_8_ = 0xd400000010;
    local_138._0_4_ = 2;
    local_138._4_4_ = 0xd1;
    local_138._8_8_ = (pointer)0xd200000004;
    auStack_120._8_8_ = (pointer)0xd500000040;
    __l_01._M_len = 5;
    __l_01._M_array = (iterator)local_138;
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
              (&unicode_regex_split::k_ucat_cpt,__l_01,(less<int> *)local_278,
               (allocator_type *)&local_220);
    __cxa_atexit(std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 ~map,&unicode_regex_split::k_ucat_cpt,&__dso_handle);
    __cxa_guard_release(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::k_ucat_cpt);
  }
  if ((unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::k_ucat_map_abi_cxx11_ == '\0') &&
     (iVar14 = __cxa_guard_acquire(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                    ::k_ucat_map_abi_cxx11_), iVar14 != 0)) {
    local_278._0_4_ = 2;
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_const_char_(&)[4],_true>
              ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_138,(anon_enum_32 *)local_278,(char (*) [4])"0-9");
    local_220._M_flags = 4;
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_const_char_(&)[7],_true>
              ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_110,&local_220._M_flags,(char (*) [7])"A-Za-z");
    local_1d0.
    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_1d0.
                           super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0x20);
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_const_char_(&)[26],_true>
              ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_e8,(anon_enum_32 *)&local_1d0,
               (char (*) [26])"!-#%-*,-/:-;?-@\\[-\\]_\\{\\}");
    local_68 = (undefined1 *)CONCAT44(local_68._4_4_,0x10);
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_const_char_(&)[1],_true>
              ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_c0,(anon_enum_32 *)&local_68,(char (*) [1])0x23e941);
    local_1a8._M_dataplus._M_p._0_4_ = 0x40;
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_const_char_(&)[12],_true>
              ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_98,(anon_enum_32 *)&local_1a8,(char (*) [12])"\\$\\+<->^`\\|");
    __l_02._M_len = 5;
    __l_02._M_array = (iterator)local_138;
    std::
    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
           ::k_ucat_map_abi_cxx11_,__l_02,(less<int> *)&local_160,(allocator_type *)&local_178);
    lVar19 = -200;
    plVar45 = (long *)((long)&local_98.first.field_2 + 8);
    do {
      if (plVar45 != (long *)plVar45[-2]) {
        operator_delete((long *)plVar45[-2],*plVar45 + 1);
      }
      plVar45 = plVar45 + -5;
      lVar19 = lVar19 + 0x28;
    } while (lVar19 != 0);
    __cxa_atexit(std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::~map,&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::k_ucat_map_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::k_ucat_map_abi_cxx11_);
  }
  pbVar40 = (regex_exprs->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (regex_exprs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar40 == pbVar2) {
    bVar12 = false;
  }
  else {
    bVar12 = false;
    p_Var20 = unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
              ::k_ucat_enum_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
joined_r0x00221220:
    do {
      if ((_Rb_tree_header *)p_Var20 !=
          &unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
           ::k_ucat_enum_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        lVar19 = std::__cxx11::string::find((char *)pbVar40,*(ulong *)(p_Var20 + 1),0);
        if (lVar19 == -1) {
          p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20);
          goto joined_r0x00221220;
        }
        bVar12 = true;
      }
      pbVar40 = pbVar40 + 1;
      p_Var20 = unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                ::k_ucat_enum_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    } while (pbVar40 != pbVar2);
  }
  unicode_cpts_from_utf8(&local_178,local_70);
  local_68 = &local_58;
  local_60 = 0;
  local_58 = 0;
  if ((bVar12) &&
     (std::__cxx11::string::resize
                ((ulong)&local_68,
                 (char)((long)local_178.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_178.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2)),
     local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish !=
     local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_start)) {
    uVar37 = 0;
    do {
      uVar17 = local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar37];
      if (uVar17 < 0x80) {
        local_68[uVar37] = (char)uVar17;
      }
      else {
        uVar13 = unicode_cpt_flags_from_cpt(uVar17);
        if (((ushort)uVar13 >> 8 & 1) == 0) {
          bVar11 = uVar13._0_1_;
          p_Var27 = &unicode_regex_split::k_ucat_cpt._M_t._M_impl.super__Rb_tree_header._M_header;
          if (unicode_regex_split::k_ucat_cpt._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
              != (_Base_ptr)0x0) {
            p_Var27 = &unicode_regex_split::k_ucat_cpt._M_t._M_impl.super__Rb_tree_header._M_header;
            p_Var29 = unicode_regex_split::k_ucat_cpt._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_parent;
            do {
              if ((int)(uint)bVar11 <= (int)p_Var29[1]._M_color) {
                p_Var27 = p_Var29;
              }
              p_Var29 = (&p_Var29->_M_left)[(int)p_Var29[1]._M_color < (int)(uint)bVar11];
            } while (p_Var29 != (_Base_ptr)0x0);
          }
          if (((_Rb_tree_header *)p_Var27 ==
               &unicode_regex_split::k_ucat_cpt._M_t._M_impl.super__Rb_tree_header) ||
             ((int)CONCAT31(0,bVar11) < (int)p_Var27[1]._M_color)) {
            local_68[uVar37] = 0xd0;
          }
          else {
            local_138._0_4_ = CONCAT31(0,bVar11);
            pmVar22 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                                (&unicode_regex_split::k_ucat_cpt,(key_type *)local_138);
            local_68[uVar37] = (char)*pmVar22;
          }
        }
        else {
          local_68[uVar37] = 0xb;
        }
      }
      uVar37 = uVar37 + 1;
    } while (uVar37 < (ulong)((long)local_178.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_178.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  local_138._0_8_ =
       (long)local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start >> 2;
  __l._M_len = 1;
  __l._M_array = (iterator)local_138;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_1f8,__l,(allocator_type *)local_278);
  pbVar40 = (regex_exprs->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_48 = (regex_exprs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar40 != local_48) {
    do {
      iVar14 = std::__cxx11::string::compare((char *)pbVar40);
      local_1e0 = pbVar40;
      if (iVar14 == 0) {
        local_278._0_8_ = (wchar_t *)0x0;
        local_278._8_4_ = 0;
        local_278._12_4_ = 0;
        local_278._16_4_ = 0;
        local_278._20_4_ = 0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_278,
                   (long)local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
        unicode_cpts_from_utf8
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_138,local_70);
        local_1b0 = (wchar_t *)
                    local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        if (local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pwVar32 = (wchar_t *)
                    local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar37 = 0;
LAB_00221b7e:
          uVar25 = uVar37 + *(unsigned_long *)pwVar32;
          local_1d8 = (string *)pwVar32;
          uVar35 = uVar37;
          local_280 = uVar37;
joined_r0x00221b95:
          do {
            if (uVar25 <= uVar35) goto LAB_00221fc3;
            uVar17 = 0xffffffff;
            if (uVar35 < uVar37) {
              uVar18 = 0;
            }
            else {
              uVar17 = *(pointer)(local_138._0_8_ + uVar35 * 4);
              uVar13 = unicode_cpt_flags_from_cpt(*(uint32_t *)(local_138._0_8_ + uVar35 * 4));
              uVar18 = (uint)(ushort)uVar13;
            }
            if ((uVar17 != 0x27) || (uVar25 <= uVar35 + 1)) goto LAB_00221c4e;
            uVar26 = 0xffffffff;
            if (uVar37 <= uVar35 + 1) {
              uVar26 = ((pointer)(local_138._0_8_ + 4))[uVar35];
            }
            if ((uVar26 - 100 < 0x11) && ((0x18201U >> (uVar26 - 100 & 0x1f) & 1) != 0)) {
              uVar43 = uVar35 + 2;
              local_220._0_8_ = uVar43 - local_280;
              if ((undefined1 *)local_220._0_8_ != (undefined1 *)0x0) {
                if ((unsigned_long *)local_278._8_8_ ==
                    (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) {
                  std::vector<unsigned_long,std::allocator<unsigned_long>>::
                  _M_realloc_insert<unsigned_long_const&>
                            ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                             (iterator)local_278._8_8_,(unsigned_long *)&local_220);
                }
                else {
LAB_00221c38:
                  *(undefined8 *)local_278._8_8_ = local_220._0_8_;
                  local_278._8_8_ = local_278._8_8_ + 8;
                }
              }
LAB_00221f49:
              uVar35 = uVar35 + local_220._0_8_;
              bVar12 = false;
              local_280 = uVar43;
            }
            else {
              bVar12 = true;
              if (uVar35 + 2 < uVar25) {
                uVar28 = 0xffffffff;
                if (uVar37 <= uVar35 + 2) {
                  uVar28 = ((pointer)(local_138._0_8_ + 8))[uVar35];
                }
                if ((((uVar26 & 0xfffffffb) == 0x72) && (uVar28 == 0x65)) ||
                   ((uVar26 == 0x6c && (uVar28 == 0x6c)))) {
                  uVar43 = uVar35 + 3;
                  local_220._0_8_ = uVar43 - local_280;
                  if ((undefined1 *)local_220._0_8_ != (undefined1 *)0x0) {
                    if ((unsigned_long *)local_278._8_8_ !=
                        (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_))
                    goto LAB_00221c38;
                    std::vector<unsigned_long,std::allocator<unsigned_long>>::
                    _M_realloc_insert<unsigned_long_const&>
                              ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                               (iterator)local_278._8_8_,(unsigned_long *)&local_220);
                  }
                  goto LAB_00221f49;
                }
              }
            }
            if (bVar12) {
LAB_00221c4e:
              if (uVar17 == 0x20) {
                uVar18 = 0;
                if ((uVar37 <= uVar35 + 1) && (uVar35 + 1 < uVar25)) {
                  uVar13 = unicode_cpt_flags_from_cpt(((pointer)(local_138._0_8_ + 4))[uVar35]);
                  uVar18 = (uint)(ushort)uVar13;
                }
              }
              if ((uVar18 & 4) == 0) {
                if ((uVar18 & 2) == 0) {
                  if ((short)uVar18 == 0 || (uVar18 >> 8 & 1) != 0) {
                    uVar46 = 0;
                    while( true ) {
                      uVar43 = uVar35 + uVar46;
                      uVar17 = 0;
                      if ((uVar37 <= uVar43) && (uVar17 = 0, uVar43 < uVar25)) {
                        uVar13 = unicode_cpt_flags_from_cpt
                                           (((pointer)(local_138._0_8_ + uVar35 * 4))[uVar46]);
                        uVar17 = (uint)(ushort)uVar13;
                      }
                      if ((uVar17 >> 8 & 1) == 0) break;
                      uVar46 = uVar46 + 1;
                    }
                    local_220._0_8_ = uVar35 + (uVar46 - local_280);
                    if ((((uVar37 <= uVar43) && (1 < uVar46)) && (uVar43 < uVar25)) &&
                       (((pointer)(uVar35 * 4 + local_138._0_8_))[uVar46] != 0xffffffff)) {
                      local_220._0_8_ = local_220._0_8_ + -1;
                      if ((undefined1 *)local_220._0_8_ != (undefined1 *)0x0) {
                        if ((unsigned_long *)local_278._8_8_ ==
                            (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) {
                          std::vector<unsigned_long,std::allocator<unsigned_long>>::
                          _M_realloc_insert<unsigned_long_const&>
                                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                                     local_278,(iterator)local_278._8_8_,(unsigned_long *)&local_220
                                    );
                        }
                        else {
                          *(undefined8 *)local_278._8_8_ = local_220._0_8_;
                          local_278._8_8_ = local_278._8_8_ + 8;
                        }
                      }
                      uVar35 = uVar35 + (uVar46 - 1);
                      local_280 = uVar35;
                      goto joined_r0x00221b95;
                    }
                    if (uVar46 == 0) {
                      uVar43 = uVar35 + 1;
                      local_220._0_8_ = uVar43 - local_280;
                      uVar35 = uVar43;
                      local_280 = uVar43;
                      if ((undefined1 *)local_220._0_8_ == (undefined1 *)0x0)
                      goto joined_r0x00221b95;
                      if ((unsigned_long *)local_278._8_8_ ==
                          (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) {
                        std::vector<unsigned_long,std::allocator<unsigned_long>>::
                        _M_realloc_insert<unsigned_long_const&>
                                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                                   (iterator)local_278._8_8_,(unsigned_long *)&local_220);
                        goto joined_r0x00221b95;
                      }
                    }
                    else {
                      uVar35 = uVar43;
                      local_280 = uVar43;
                      if ((undefined1 *)local_220._0_8_ == (undefined1 *)0x0)
                      goto joined_r0x00221b95;
                      if ((unsigned_long *)local_278._8_8_ ==
                          (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) {
                        std::vector<unsigned_long,std::allocator<unsigned_long>>::
                        _M_realloc_insert<unsigned_long_const&>
                                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                                   (iterator)local_278._8_8_,(unsigned_long *)&local_220);
                        goto joined_r0x00221b95;
                      }
                    }
                  }
                  else {
                    uVar43 = uVar35 + (uVar17 == 0x20);
                    do {
                      uVar43 = uVar43 + 1;
                      uVar13 = (unicode_cpt_flags)0x0;
                      if ((uVar37 <= uVar43) && (uVar13 = (unicode_cpt_flags)0x0, uVar43 < uVar25))
                      {
                        uVar13 = unicode_cpt_flags_from_cpt
                                           (*(uint32_t *)(local_138._0_8_ + uVar43 * 4));
                      }
                    } while ((uVar13 != (unicode_cpt_flags)0x0) &&
                            ((((ushort)uVar13 >> 1 | (ushort)uVar13 >> 2 | (ushort)uVar13 >> 8) & 1)
                             == 0));
                    local_220._0_8_ = uVar43 - local_280;
                    uVar35 = uVar43;
                    local_280 = uVar43;
                    if ((undefined1 *)local_220._0_8_ == (undefined1 *)0x0) goto joined_r0x00221b95;
                    if ((unsigned_long *)local_278._8_8_ ==
                        (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) {
                      std::vector<unsigned_long,std::allocator<unsigned_long>>::
                      _M_realloc_insert<unsigned_long_const&>
                                ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                                 (iterator)local_278._8_8_,(unsigned_long *)&local_220);
                      goto joined_r0x00221b95;
                    }
                  }
                }
                else {
                  uVar43 = uVar35 + (uVar17 == 0x20);
                  do {
                    uVar43 = uVar43 + 1;
                    uVar13 = (unicode_cpt_flags)0x0;
                    if ((uVar37 <= uVar43) && (uVar43 < uVar25)) {
                      uVar13 = unicode_cpt_flags_from_cpt
                                         (*(uint32_t *)(local_138._0_8_ + uVar43 * 4));
                    }
                  } while (((ushort)uVar13 & 2) != 0);
                  local_220._0_8_ = uVar43 - local_280;
                  uVar35 = uVar43;
                  local_280 = uVar43;
                  if ((undefined1 *)local_220._0_8_ == (undefined1 *)0x0) goto joined_r0x00221b95;
                  if ((unsigned_long *)local_278._8_8_ ==
                      (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) {
                    std::vector<unsigned_long,std::allocator<unsigned_long>>::
                    _M_realloc_insert<unsigned_long_const&>
                              ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                               (iterator)local_278._8_8_,(unsigned_long *)&local_220);
                    goto joined_r0x00221b95;
                  }
                }
              }
              else {
                uVar43 = uVar35 + (uVar17 == 0x20);
                do {
                  uVar43 = uVar43 + 1;
                  uVar13 = (unicode_cpt_flags)0x0;
                  if ((uVar37 <= uVar43) && (uVar43 < uVar25)) {
                    uVar13 = unicode_cpt_flags_from_cpt(*(uint32_t *)(local_138._0_8_ + uVar43 * 4))
                    ;
                  }
                } while (((ushort)uVar13 & 4) != 0);
                local_220._0_8_ = uVar43 - local_280;
                uVar35 = uVar43;
                local_280 = uVar43;
                if ((undefined1 *)local_220._0_8_ == (undefined1 *)0x0) goto joined_r0x00221b95;
                if ((unsigned_long *)local_278._8_8_ ==
                    (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) {
                  std::vector<unsigned_long,std::allocator<unsigned_long>>::
                  _M_realloc_insert<unsigned_long_const&>
                            ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                             (iterator)local_278._8_8_,(unsigned_long *)&local_220);
                  goto joined_r0x00221b95;
                }
              }
              *(undefined8 *)local_278._8_8_ = local_220._0_8_;
              local_278._8_8_ = local_278._8_8_ + 8;
              uVar35 = uVar43;
              local_280 = uVar43;
            }
          } while( true );
        }
LAB_00221fe0:
        pwVar32 = (wchar_t *)local_278._8_8_;
        if ((pair<const_int,_int>)local_138._0_8_ != (pair<const_int,_int>)0x0) {
          operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
          pwVar32 = (wchar_t *)local_278._8_8_;
        }
        pwVar34 = (wchar_t *)CONCAT44(local_278._20_4_,local_278._16_4_);
        pwVar41 = (wchar_t *)local_278._0_8_;
        pbVar40 = local_1e0;
        local_278._8_8_ = pwVar32;
      }
      else {
        iVar14 = std::__cxx11::string::compare((char *)pbVar40);
        if (iVar14 == 0) {
LAB_0022144c:
          local_278._0_8_ = (wchar_t *)0x0;
          local_278._8_4_ = 0;
          local_278._12_4_ = 0;
          local_278._16_4_ = 0;
          local_278._20_4_ = 0;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_278,
                     (long)local_1f8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_1f8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3);
          unicode_cpts_from_utf8
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_138,local_70);
          local_40 = (wchar_t *)
                     local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          if (local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pwVar32 = (wchar_t *)
                      local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            psVar38 = (string *)(wchar_t *)0x0;
LAB_002214af:
            pwVar41 = (wchar_t *)(*(unsigned_long *)pwVar32 + (long)psVar38);
            local_38 = pwVar32;
            pwVar32 = (wchar_t *)psVar38;
            pwVar34 = (wchar_t *)psVar38;
            local_1d8 = psVar38;
joined_r0x002214d3:
            do {
              if (pwVar41 <= pwVar34) goto LAB_00221afa;
              uVar17 = 0xffffffff;
              if (pwVar34 < psVar38) {
                uVar37 = 0;
              }
              else {
                uVar17 = *(pointer)(local_138._0_8_ + (long)pwVar34 * 4);
                uVar13 = unicode_cpt_flags_from_cpt
                                   (*(uint32_t *)(local_138._0_8_ + (long)pwVar34 * 4));
                uVar37 = CONCAT62(extraout_var,uVar13);
              }
              if (uVar17 != 0x27) break;
              local_1b0 = (wchar_t *)CONCAT44(local_1b0._4_4_,(int)uVar37);
              if (pwVar41 <= (wchar_t *)((long)pwVar34 + 1U)) {
                uVar37 = uVar37 & 0xffffffff;
                break;
              }
              uVar15 = 0xffffffff;
              if (psVar38 <= (wchar_t *)((long)pwVar34 + 1U)) {
                uVar15 = ((pointer)(local_138._0_8_ + 4))[(long)pwVar34];
              }
              uVar15 = unicode_tolower(uVar15);
              if ((uVar15 - 100 < 0x11) && ((0x18201U >> (uVar15 - 100 & 0x1f) & 1) != 0)) {
                pwVar31 = (wchar_t *)((long)pwVar34 + 2);
                local_220._0_8_ = (long)pwVar31 - (long)pwVar32;
                if ((undefined1 *)local_220._0_8_ != (undefined1 *)0x0) {
                  if ((unsigned_long *)local_278._8_8_ ==
                      (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) {
                    std::vector<unsigned_long,std::allocator<unsigned_long>>::
                    _M_realloc_insert<unsigned_long_const&>
                              ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                               (iterator)local_278._8_8_,(unsigned_long *)&local_220);
                  }
                  else {
LAB_00221577:
                    *(undefined8 *)local_278._8_8_ = local_220._0_8_;
                    local_278._8_8_ = local_278._8_8_ + 8;
                  }
                }
LAB_0022162e:
                pwVar34 = (wchar_t *)((long)pwVar34 + local_220._0_8_);
                bVar12 = false;
                pwVar32 = pwVar31;
              }
              else {
                bVar12 = true;
                local_200 = pwVar32;
                if ((wchar_t *)((long)pwVar34 + 2U) < pwVar41) {
                  uVar16 = 0xffffffff;
                  if (psVar38 <= (wchar_t *)((long)pwVar34 + 2U)) {
                    uVar16 = ((pointer)(local_138._0_8_ + 8))[(long)pwVar34];
                  }
                  uVar16 = unicode_tolower(uVar16);
                  if ((((uVar15 & 0xfffffffb) == 0x72) && (uVar16 == 0x65)) ||
                     ((pwVar32 = local_200, uVar15 == 0x6c && (uVar16 == 0x6c)))) {
                    pwVar31 = (wchar_t *)((long)pwVar34 + 3);
                    local_220._0_8_ = (long)pwVar31 - (long)local_200;
                    if ((undefined1 *)local_220._0_8_ != (undefined1 *)0x0) {
                      if ((unsigned_long *)local_278._8_8_ !=
                          (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_))
                      goto LAB_00221577;
                      std::vector<unsigned_long,std::allocator<unsigned_long>>::
                      _M_realloc_insert<unsigned_long_const&>
                                ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                                 (iterator)local_278._8_8_,(unsigned_long *)&local_220);
                    }
                    goto LAB_0022162e;
                  }
                }
              }
              uVar37 = (ulong)local_1b0 & 0xffffffff;
            } while (!bVar12);
            if (((uVar17 == 10) || (uVar17 == 0xd)) || ((uVar37 & 2) != 0)) {
LAB_00221696:
              pwVar31 = pwVar34;
              if ((uVar37 & 2) != 0) {
                do {
                  uVar37 = 0;
                  do {
                    uVar13 = (unicode_cpt_flags)0x0;
                    if ((psVar38 <= pwVar31) && (uVar13 = (unicode_cpt_flags)0x0, pwVar31 < pwVar41)
                       ) {
                      uVar13 = unicode_cpt_flags_from_cpt
                                         (*(uint32_t *)(local_138._0_8_ + (long)pwVar31 * 4));
                    }
                    if (((ushort)uVar13 & 2) == 0) {
                      local_220._0_8_ = (long)pwVar31 - (long)pwVar32;
                      pwVar32 = pwVar31;
                      pwVar34 = pwVar31;
                      if ((undefined1 *)local_220._0_8_ == (undefined1 *)0x0)
                      goto joined_r0x002214d3;
                      if ((unsigned_long *)local_278._8_8_ !=
                          (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_))
                      goto LAB_002217dc;
                      std::vector<unsigned_long,std::allocator<unsigned_long>>::
                      _M_realloc_insert<unsigned_long_const&>
                                ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                                 (iterator)local_278._8_8_,(unsigned_long *)&local_220);
                      goto joined_r0x002214d3;
                    }
                    pwVar31 = (wchar_t *)((long)pwVar31 + 1);
                    uVar37 = uVar37 + 1;
                  } while (uVar37 < 3);
                  local_220._0_8_ = (long)pwVar31 - (long)pwVar32;
                  pwVar32 = pwVar31;
                  if ((undefined1 *)local_220._0_8_ != (undefined1 *)0x0) {
                    if ((unsigned_long *)local_278._8_8_ ==
                        (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) {
                      std::vector<unsigned_long,std::allocator<unsigned_long>>::
                      _M_realloc_insert<unsigned_long_const&>
                                ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                                 (iterator)local_278._8_8_,(unsigned_long *)&local_220);
                    }
                    else {
                      *(undefined8 *)local_278._8_8_ = local_220._0_8_;
                      local_278._8_8_ = local_278._8_8_ + 8;
                    }
                  }
                } while( true );
              }
              sVar7 = (short)uVar37;
              if (uVar17 == 0x20) {
                uVar37 = 0;
                if ((psVar38 <= (wchar_t *)((long)pwVar34 + 1U)) &&
                   ((wchar_t *)((long)pwVar34 + 1U) < pwVar41)) {
                  uVar13 = unicode_cpt_flags_from_cpt
                                     (((pointer)(local_138._0_8_ + 4))[(long)pwVar34]);
                  uVar37 = (ulong)(ushort)uVar13;
                }
              }
              uVar35 = uVar37 & 0xffff;
              if (((((uint)(uVar35 >> 1) | (uint)(uVar35 >> 2) | (uint)(uVar35 >> 8)) & 1) != 0) ||
                 (sVar7 == 0)) {
                lVar19 = (long)pwVar34 * 4;
                uVar37 = 0;
                pwVar31 = (wchar_t *)0x0;
                psVar39 = psVar38;
                local_200 = pwVar32;
                while( true ) {
                  pwVar32 = (wchar_t *)(uVar37 + (long)pwVar34);
                  if (pwVar41 <= pwVar32 || pwVar32 < psVar39) {
                    uVar17 = 0;
                  }
                  else {
                    uVar13 = unicode_cpt_flags_from_cpt
                                       (((pointer)(local_138._0_8_ + lVar19))[uVar37]);
                    uVar17 = (uint)(ushort)uVar13;
                  }
                  psVar38 = local_1d8;
                  if ((uVar17 >> 8 & 1) == 0) break;
                  uVar17 = 0xffffffff;
                  if (pwVar32 < pwVar41 && pwVar32 >= psVar39) {
                    uVar17 = ((pointer)(local_138._0_8_ + lVar19))[uVar37];
                  }
                  if ((uVar17 == 0xd) || (uVar17 == 10)) {
                    pwVar31 = (wchar_t *)((long)pwVar34 + uVar37 + 1);
                  }
                  uVar37 = uVar37 + 1;
                  psVar39 = local_1d8;
                }
                if (pwVar31 == (wchar_t *)0x0) {
                  local_220._0_8_ = (long)pwVar34 + (uVar37 - (long)local_200);
                  if ((((local_1d8 <= pwVar32) && (1 < uVar37)) && (pwVar32 < pwVar41)) &&
                     (((pointer)(lVar19 + local_138._0_8_))[uVar37] != 0xffffffff)) {
                    local_220._0_8_ = local_220._0_8_ + -1;
                    if ((undefined1 *)local_220._0_8_ != (undefined1 *)0x0) {
                      if ((unsigned_long *)local_278._8_8_ ==
                          (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) {
                        std::vector<unsigned_long,std::allocator<unsigned_long>>::
                        _M_realloc_insert<unsigned_long_const&>
                                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                                   (iterator)local_278._8_8_,(unsigned_long *)&local_220);
                      }
                      else {
                        *(undefined8 *)local_278._8_8_ = local_220._0_8_;
                        local_278._8_8_ = local_278._8_8_ + 8;
                      }
                    }
                    pwVar32 = (wchar_t *)((long)pwVar34 + (uVar37 - 1));
                    pwVar34 = pwVar32;
                    goto joined_r0x002214d3;
                  }
                  if (uVar37 != 0) {
                    pwVar34 = pwVar32;
                    if ((undefined1 *)local_220._0_8_ != (undefined1 *)0x0) {
                      if ((unsigned_long *)local_278._8_8_ ==
                          (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) {
                        std::vector<unsigned_long,std::allocator<unsigned_long>>::
                        _M_realloc_insert<unsigned_long_const&>
                                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                                   (iterator)local_278._8_8_,(unsigned_long *)&local_220);
                      }
                      else {
                        *(undefined8 *)local_278._8_8_ = local_220._0_8_;
                        local_278._8_8_ = local_278._8_8_ + 8;
                      }
                    }
                    goto joined_r0x002214d3;
                  }
                  pwVar31 = (wchar_t *)((long)pwVar34 + 1);
                  local_220._0_8_ = (long)pwVar31 - (long)local_200;
                  pwVar32 = pwVar31;
                  pwVar34 = pwVar31;
                  if ((undefined1 *)local_220._0_8_ == (undefined1 *)0x0) goto joined_r0x002214d3;
                  if ((unsigned_long *)local_278._8_8_ ==
                      (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) {
                    std::vector<unsigned_long,std::allocator<unsigned_long>>::
                    _M_realloc_insert<unsigned_long_const&>
                              ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                               (iterator)local_278._8_8_,(unsigned_long *)&local_220);
                    goto joined_r0x002214d3;
                  }
                }
                else {
                  local_220._0_8_ = (long)pwVar31 - (long)local_200;
                  pwVar32 = pwVar31;
                  pwVar34 = pwVar31;
                  if ((undefined1 *)local_220._0_8_ == (undefined1 *)0x0) goto joined_r0x002214d3;
                  if ((unsigned_long *)local_278._8_8_ ==
                      (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) {
                    std::vector<unsigned_long,std::allocator<unsigned_long>>::
                    _M_realloc_insert<unsigned_long_const&>
                              ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                               (iterator)local_278._8_8_,(unsigned_long *)&local_220);
                    goto joined_r0x002214d3;
                  }
                }
LAB_002217dc:
                *(undefined8 *)local_278._8_8_ = local_220._0_8_;
                local_278._8_8_ = local_278._8_8_ + 8;
                pwVar32 = pwVar31;
                pwVar34 = pwVar31;
                goto joined_r0x002214d3;
              }
              if ((short)uVar37 == 0) {
                pwVar34 = (wchar_t *)((long)pwVar34 + (ulong)(uVar17 == 0x20));
              }
              else {
                pwVar34 = (wchar_t *)((long)pwVar34 + (ulong)(uVar17 == 0x20));
                do {
                  pwVar34 = (wchar_t *)((long)pwVar34 + 1);
                  uVar13 = (unicode_cpt_flags)0x0;
                  if ((psVar38 <= pwVar34) && (uVar13 = (unicode_cpt_flags)0x0, pwVar34 < pwVar41))
                  {
                    uVar13 = unicode_cpt_flags_from_cpt
                                       (*(uint32_t *)(local_138._0_8_ + (long)pwVar34 * 4));
                  }
                } while ((uVar13 != (unicode_cpt_flags)0x0) &&
                        ((((ushort)uVar13 >> 1 | (ushort)uVar13 >> 2 | (ushort)uVar13 >> 8) & 1) ==
                         0));
              }
              uVar17 = 0xffffffff;
              if ((psVar38 <= pwVar34) && (pwVar34 < pwVar41)) {
                uVar17 = *(pointer)(local_138._0_8_ + (long)pwVar34 * 4);
              }
              lVar19 = -(long)pwVar34;
              while ((pwVar34 = (wchar_t *)((long)pwVar34 + 1), uVar17 == 0xd || (uVar17 == 10))) {
                uVar17 = 0xffffffff;
                if ((psVar38 <= pwVar34) && (pwVar34 < pwVar41)) {
                  uVar17 = *(uint *)(local_138._0_8_ + (long)pwVar34 * 4);
                }
                lVar19 = lVar19 + -1;
              }
              local_220._0_8_ = -lVar19 - (long)pwVar32;
              if ((undefined1 *)local_220._0_8_ == (undefined1 *)0x0) goto LAB_00221a66;
              if ((unsigned_long *)local_278._8_8_ ==
                  (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                           (iterator)local_278._8_8_,(unsigned_long *)&local_220);
                goto LAB_00221a66;
              }
            }
            else {
              if ((uVar37 & 4) == 0) {
                uVar37 = uVar37 & 0xffffffff;
                uVar13 = (unicode_cpt_flags)0x0;
                if ((psVar38 <= (wchar_t *)((long)pwVar34 + 1U)) &&
                   (uVar13 = (unicode_cpt_flags)0x0, (wchar_t *)((long)pwVar34 + 1U) < pwVar41)) {
                  uVar13 = unicode_cpt_flags_from_cpt
                                     (((pointer)(local_138._0_8_ + 4))[(long)pwVar34]);
                }
                if (((ushort)uVar13 & 4) == 0) goto LAB_00221696;
              }
              lVar19 = -(long)pwVar34;
              do {
                pwVar34 = (wchar_t *)((long)pwVar34 + 1);
                uVar13 = (unicode_cpt_flags)0x0;
                if ((psVar38 <= pwVar34) && (uVar13 = (unicode_cpt_flags)0x0, pwVar34 < pwVar41)) {
                  uVar13 = unicode_cpt_flags_from_cpt
                                     (*(uint32_t *)(local_138._0_8_ + (long)pwVar34 * 4));
                }
                lVar19 = lVar19 + -1;
              } while (((ushort)uVar13 & 4) != 0);
              local_220._0_8_ = -lVar19 - (long)pwVar32;
              if ((undefined1 *)local_220._0_8_ == (undefined1 *)0x0) goto LAB_00221a66;
              if ((unsigned_long *)local_278._8_8_ ==
                  (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                           (iterator)local_278._8_8_,(unsigned_long *)&local_220);
                goto LAB_00221a66;
              }
            }
            *(undefined8 *)local_278._8_8_ = local_220._0_8_;
            local_278._8_8_ = local_278._8_8_ + 8;
LAB_00221a66:
            pwVar32 = (wchar_t *)-lVar19;
            pwVar34 = (wchar_t *)-lVar19;
            goto joined_r0x002214d3;
          }
          goto LAB_00221fe0;
        }
        iVar14 = std::__cxx11::string::compare((char *)pbVar40);
        if (iVar14 == 0) goto LAB_0022144c;
        pwVar34 = (wchar_t *)0x0;
        pwVar32 = (wchar_t *)0x0;
        pwVar41 = (wchar_t *)0x0;
      }
      puVar8 = local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pwVar41 == pwVar32) {
        p_Var20 = unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                  ::k_ucat_enum_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_200 = pwVar34;
        local_1b0 = pwVar41;
        if ((_Rb_tree_header *)
            unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
            ::k_ucat_enum_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
            &unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
             ::k_ucat_enum_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
LAB_002226d9:
          std::__cxx11::
          wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
          ::wstring_convert((wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
                             *)local_138);
          pcVar42 = (pbVar40->_M_dataplus)._M_p;
          std::__cxx11::
          wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
          ::from_bytes(&local_1a8,
                       (wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
                        *)local_138,pcVar42,pcVar42 + pbVar40->_M_string_length);
          std::__cxx11::
          wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
          ::~wstring_convert((wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
                              *)local_138);
          local_160.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)&local_160.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data + 0x10);
          std::__cxx11::wstring::
          _M_construct<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                    ((wstring *)&local_160,
                     local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
          if (local_160.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) {
            puVar36 = (pointer)0x0;
            do {
              if (L'\x7f' < (int)local_160.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[(long)puVar36]) {
                uVar13 = unicode_cpt_flags_from_cpt
                                   (local_160.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[(long)puVar36]);
                if (((ushort)uVar13 >> 8 & 1) != 0) {
                  local_160.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)puVar36] = L'\v';
                }
              }
              puVar36 = (pointer)((long)puVar36 + 1);
            } while (puVar36 < local_160.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish);
          }
          std::__cxx11::basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>>::
          basic_regex<std::char_traits<wchar_t>,std::allocator<wchar_t>>
                    ((basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>> *)&local_220,
                     &local_1a8,0x10);
          local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                    (&local_238,
                     (long)local_1f8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_1f8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3);
          local_1d8 = (string *)
                      local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          if (local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            lVar19 = 0;
            pwVar32 = (wchar_t *)
                      local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            do {
              uVar4 = *(unsigned_long *)pwVar32;
              std::__cxx11::
              regex_iterator<const_wchar_t_*,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>::
              regex_iterator((regex_iterator<const_wchar_t_*,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
                              *)local_138,
                             (wchar_t *)
                             (local_160.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar19),
                             (wchar_t *)
                             (local_160.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar19 + uVar4),
                             (regex_type *)&local_220,0);
              local_248 = (pointer)0x0;
              pwStack_240 = (wchar_t *)0x0;
              local_258 = (pointer)0x0;
              psStack_250 = (pointer)0x0;
              local_278._16_4_ = 0;
              local_278._20_4_ = 0;
              local_278._24_4_ = 0;
              local_278._0_8_ = (wchar_t *)0x0;
              local_278._8_4_ = 0;
              local_278._12_4_ = 0;
              bVar12 = std::__cxx11::
                       regex_iterator<const_wchar_t_*,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
                       ::operator==((regex_iterator<const_wchar_t_*,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
                                     *)local_138,
                                    (regex_iterator<const_wchar_t_*,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
                                     *)local_278);
              lVar30 = 0;
              while (!bVar12) {
                std::
                vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                ::vector((vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                          *)&local_1d0,
                         (vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                          *)(auStack_120 + 8));
                psVar24 = local_1d0.
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if ((long)local_1d0.
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_1d0.
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start == 0x48) {
                  psVar24 = local_1d0.
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -3;
                }
                local_1b8 = (char *)local_110.first.field_2._M_allocated_capacity;
                if (local_1d0.
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    local_1d0.
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  psVar24 = local_1d0.
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -3;
                }
                if (lVar30 < (long)(psVar24->super_pair<const_char_*,_const_char_*>).first -
                             local_110.first.field_2._0_8_ >> 2) {
                  local_180 = ((long)(psVar24->super_pair<const_char_*,_const_char_*>).first -
                               local_110.first.field_2._0_8_ >> 2) - lVar30;
                  if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish ==
                      local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                    _M_realloc_insert<long>
                              (&local_238,
                               (iterator)
                               local_238.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish,(long *)&local_180);
                  }
                  else {
                    *local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish = local_180;
                    local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 1;
                  }
                }
                psVar24 = local_1d0.
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if ((long)local_1d0.
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_1d0.
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start == 0x48) {
                  psVar24 = local_1d0.
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -3;
                }
                if (local_1d0.
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    local_1d0.
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  psVar24 = local_1d0.
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -3;
                }
                local_180 = (long)(psVar24->super_pair<const_char_*,_const_char_*>).second -
                            (long)(psVar24->super_pair<const_char_*,_const_char_*>).first >> 2;
                if (psVar24->matched == false) {
                  local_180 = 0;
                }
                if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                  _M_realloc_insert<long>
                            (&local_238,
                             (iterator)
                             local_238.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish,(long *)&local_180);
                }
                else {
                  *local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish = local_180;
                  local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                pcVar42 = local_1b8;
                psVar24 = local_1d0.
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if ((long)local_1d0.
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_1d0.
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start == 0x48) {
                  psVar24 = local_1d0.
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -3;
                }
                if (local_1d0.
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    local_1d0.
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  psVar24 = local_1d0.
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -3;
                }
                pcVar6 = (psVar24->super_pair<const_char_*,_const_char_*>).first;
                pcVar5 = (psVar24->super_pair<const_char_*,_const_char_*>).second;
                bVar12 = psVar24->matched;
                std::__cxx11::
                regex_iterator<const_wchar_t_*,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>::
                operator++((regex_iterator<const_wchar_t_*,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
                            *)local_138);
                lVar30 = (long)pcVar5 - (long)pcVar6 >> 2;
                if (bVar12 == false) {
                  lVar30 = 0;
                }
                if (local_1d0.
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_1d0.
                                  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_1d0.
                                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_1d0.
                                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                lVar30 = lVar30 + ((long)pcVar6 - (long)pcVar42 >> 2);
                bVar12 = std::__cxx11::
                         regex_iterator<const_wchar_t_*,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
                         ::operator==((regex_iterator<const_wchar_t_*,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
                                       *)local_138,
                                      (regex_iterator<const_wchar_t_*,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
                                       *)local_278);
                pbVar40 = local_1e0;
              }
              psVar24 = (pointer)(uVar4 - lVar30);
              if (psVar24 != (pointer)0x0 && lVar30 <= (long)uVar4) {
                local_1d0.
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start = psVar24;
                if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                  _M_realloc_insert<unsigned_long>
                            (&local_238,
                             (iterator)
                             local_238.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_1d0);
                }
                else {
                  *local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish = (unsigned_long)psVar24;
                  local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
              }
              if (local_258 != (pointer)0x0) {
                operator_delete(local_258,(long)local_248 - (long)local_258);
              }
              if ((pointer)auStack_120._8_8_ != (pointer)0x0) {
                operator_delete((void *)auStack_120._8_8_,
                                local_110.first._M_string_length - auStack_120._8_8_);
              }
              lVar19 = lVar19 + uVar4;
              pwVar32 = pwVar32 + 2;
            } while ((string *)pwVar32 != local_1d8);
          }
          std::__cxx11::basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_>::~basic_regex
                    ((basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> *)&local_220);
          puVar9 = local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
          puVar8 = local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((wchar_t *)puVar8 != (wchar_t *)0x0) {
            operator_delete(puVar8,(long)puVar9 - (long)puVar8);
          }
          pwVar32 = local_200;
          if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_238.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_238.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_238.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if ((pointer *)
              local_160.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (pointer *)
              ((long)&local_160.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data + 0x10U)) {
            operator_delete(local_160.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_160.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage * 4 + 4);
          }
          pwVar34 = local_1b0;
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_1a8._M_dataplus._M_p == &local_1a8.field_2) goto LAB_00222b55;
          uVar37 = local_1a8.field_2._M_allocated_capacity * 4 + 4;
          _Var33._M_p = local_1a8._M_dataplus._M_p;
        }
        else {
          do {
            lVar19 = std::__cxx11::string::find((char *)local_1e0,*(ulong *)(p_Var20 + 1),0);
            bVar12 = false;
            if (lVar19 != -1) {
              bVar12 = true;
              break;
            }
            p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20);
          } while ((_Rb_tree_header *)p_Var20 !=
                   &unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                    ::k_ucat_enum_abi_cxx11_._M_t._M_impl.super__Rb_tree_header);
          pbVar40 = local_1e0;
          if (!bVar12) goto LAB_002226d9;
          unicode_cpts_from_utf8(&local_160,local_1e0);
          if ((long)local_160.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_160.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start != 0) {
            lVar19 = (long)local_160.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_160.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 2;
            lVar30 = 0;
            do {
              if (0x7f < local_160.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar30]) {
                this = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error
                          (this,
                           "Regex includes both unicode categories and non-ASCII characters - not supported"
                          );
                __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
              }
              lVar30 = lVar30 + 1;
            } while (lVar19 + (ulong)(lVar19 == 0) != lVar30);
          }
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          local_1a8._M_string_length = 0;
          local_1a8.field_2._M_allocated_capacity =
               local_1a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
          uVar37 = pbVar40->_M_string_length;
          if (uVar37 != 0) {
            uVar35 = 0;
            bVar12 = false;
            do {
              pcVar3 = (pbVar40->_M_dataplus)._M_p;
              cVar1 = pcVar3[uVar35];
              if ((cVar1 == '[') && ((uVar35 == 0 || (pcVar3[uVar35 - 1] != '\\')))) {
                bVar12 = true;
                std::__cxx11::string::push_back((char)&local_1a8);
              }
              else if (((bool)(cVar1 != ']' | ~bVar12)) || (pcVar3[uVar35 - 1] == '\\')) {
                if ((((cVar1 == '\\') && (uVar25 = uVar35 + 4, uVar25 < uVar37)) &&
                    (pcVar3[uVar35 + 1] == 'p')) &&
                   ((pcVar3[uVar35 + 2] == '{' && (pcVar3[uVar25] == '}')))) {
                  std::__cxx11::string::substr((ulong)local_138,(ulong)pbVar40);
                  cVar21 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           ::find(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                   ::k_ucat_enum_abi_cxx11_._M_t,(key_type *)local_138);
                  if ((_Rb_tree_header *)cVar21._M_node !=
                      &unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                       ::k_ucat_enum_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
                    if (!bVar12) {
                      std::__cxx11::string::push_back((char)&local_1a8);
                    }
                    pmVar22 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              ::at(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                    ::k_ucat_enum_abi_cxx11_,(key_type *)local_138);
                    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::at(&unicode_regex_split::k_ucat_cpt,pmVar22);
                    std::__cxx11::string::push_back((char)&local_1a8);
                    pmVar22 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              ::at(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                    ::k_ucat_enum_abi_cxx11_,(key_type *)local_138);
                    pmVar23 = std::
                              map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::at(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                    ::k_ucat_map_abi_cxx11_,pmVar22);
                    std::__cxx11::string::_M_append
                              ((char *)&local_1a8,(ulong)(pmVar23->_M_dataplus)._M_p);
                    uVar35 = uVar25;
                    if (!bVar12) {
                      std::__cxx11::string::push_back((char)&local_1a8);
                    }
                  }
                  if (local_138._0_8_ != (long)local_138 + 0x10) {
                    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
                  }
                  if ((_Rb_tree_header *)cVar21._M_node !=
                      &unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                       ::k_ucat_enum_abi_cxx11_._M_t._M_impl.super__Rb_tree_header)
                  goto LAB_0022231d;
                }
                std::__cxx11::string::push_back((char)&local_1a8);
              }
              else {
                std::__cxx11::string::push_back((char)&local_1a8);
                bVar12 = false;
              }
LAB_0022231d:
              uVar35 = uVar35 + 1;
              uVar37 = pbVar40->_M_string_length;
            } while (uVar35 < uVar37);
          }
          std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
          basic_regex<std::char_traits<char>,std::allocator<char>>
                    ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_220,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8
                     ,0x10);
          local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                    (&local_238,
                     (long)local_1f8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_1f8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3);
          local_1d8 = (string *)
                      local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          if (local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            lVar19 = 0;
            pwVar32 = (wchar_t *)
                      local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            do {
              uVar4 = *(unsigned_long *)pwVar32;
              std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
              regex_iterator((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>
                              *)local_138,local_68 + lVar19,local_68 + lVar19 + uVar4,&local_220,0);
              local_248 = (pointer)0x0;
              pwStack_240 = (wchar_t *)0x0;
              local_258 = (pointer)0x0;
              psStack_250 = (pointer)0x0;
              local_278._16_4_ = 0;
              local_278._20_4_ = 0;
              local_278._24_4_ = 0;
              local_278._0_8_ = (wchar_t *)0x0;
              local_278._8_4_ = 0;
              local_278._12_4_ = 0;
              bVar12 = std::__cxx11::
                       regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
                       operator==((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>
                                   *)local_138,
                                  (regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>
                                   *)local_278);
              pcVar42 = (char *)0x0;
              while (!bVar12) {
                std::
                vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ::vector(&local_1d0,
                         (vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          *)(auStack_120 + 8));
                psVar24 = local_1d0.
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if ((long)local_1d0.
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_1d0.
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start == 0x48) {
                  psVar24 = local_1d0.
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -3;
                }
                if (local_1d0.
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    local_1d0.
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  psVar24 = local_1d0.
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -3;
                }
                local_1b8 = (char *)local_110.first.field_2._M_allocated_capacity;
                if ((long)pcVar42 <
                    (long)(psVar24->super_pair<const_char_*,_const_char_*>).first -
                    local_110.first.field_2._0_8_) {
                  local_180 = (long)(psVar24->super_pair<const_char_*,_const_char_*>).first -
                              (long)(pcVar42 + local_110.first.field_2._M_allocated_capacity);
                  if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish ==
                      local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                    _M_realloc_insert<long>
                              (&local_238,
                               (iterator)
                               local_238.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish,(long *)&local_180);
                  }
                  else {
                    *local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish = local_180;
                    local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 1;
                  }
                }
                psVar24 = local_1d0.
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if ((long)local_1d0.
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_1d0.
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start == 0x48) {
                  psVar24 = local_1d0.
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -3;
                }
                if (local_1d0.
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    local_1d0.
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  psVar24 = local_1d0.
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -3;
                }
                local_180 = (long)(psVar24->super_pair<const_char_*,_const_char_*>).second -
                            (long)(psVar24->super_pair<const_char_*,_const_char_*>).first;
                if (psVar24->matched == false) {
                  local_180 = 0;
                }
                if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                  _M_realloc_insert<long>
                            (&local_238,
                             (iterator)
                             local_238.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish,(long *)&local_180);
                }
                else {
                  *local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish = local_180;
                  local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                pcVar6 = local_1b8;
                psVar24 = local_1d0.
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if ((long)local_1d0.
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_1d0.
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start == 0x48) {
                  psVar24 = local_1d0.
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -3;
                }
                if (local_1d0.
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    local_1d0.
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  psVar24 = local_1d0.
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -3;
                }
                pcVar42 = (psVar24->super_pair<const_char_*,_const_char_*>).first;
                pcVar5 = (psVar24->super_pair<const_char_*,_const_char_*>).second;
                bVar12 = psVar24->matched;
                std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>
                ::operator++((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>
                              *)local_138);
                if (bVar12 == false) {
                  lVar30 = 0;
                }
                else {
                  lVar30 = (long)pcVar5 - (long)pcVar42;
                }
                if (local_1d0.
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_1d0.
                                  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_1d0.
                                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_1d0.
                                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                pcVar42 = pcVar42 + (lVar30 - (long)pcVar6);
                bVar12 = std::__cxx11::
                         regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
                         operator==((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>
                                     *)local_138,
                                    (regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>
                                     *)local_278);
                pbVar40 = local_1e0;
              }
              psVar24 = (pointer)(uVar4 - (long)pcVar42);
              if (psVar24 != (pointer)0x0 && (long)pcVar42 <= (long)uVar4) {
                local_1d0.
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start = psVar24;
                if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                  _M_realloc_insert<unsigned_long>
                            (&local_238,
                             (iterator)
                             local_238.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_1d0);
                }
                else {
                  *local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish = (unsigned_long)psVar24;
                  local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
              }
              if (local_258 != (pointer)0x0) {
                operator_delete(local_258,(long)local_248 - (long)local_258);
              }
              if ((pointer)auStack_120._8_8_ != (pointer)0x0) {
                operator_delete((void *)auStack_120._8_8_,
                                local_110.first._M_string_length - auStack_120._8_8_);
              }
              lVar19 = lVar19 + uVar4;
              pwVar32 = pwVar32 + 2;
            } while ((string *)pwVar32 != local_1d8);
          }
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    (&local_220);
          puVar9 = local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
          puVar8 = local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((wchar_t *)puVar8 != (wchar_t *)0x0) {
            operator_delete(puVar8,(long)puVar9 - (long)puVar8);
          }
          pwVar32 = local_200;
          if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_238.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_238.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_238.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          pwVar34 = local_1b0;
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_160.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start ==
              (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)0x0) goto LAB_00222b55;
          uVar37 = (long)local_160.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage -
                   (long)local_160.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          _Var33._M_p = (pointer)local_160.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
        }
        operator_delete(_Var33._M_p,uVar37);
        pwVar34 = local_1b0;
      }
      else {
        local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)pwVar32;
        if ((wchar_t *)
            local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (wchar_t *)0x0) {
          uVar37 = (long)local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                   (long)local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)pwVar41;
          local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)pwVar34;
          operator_delete(puVar8,uVar37);
          pwVar41 = (wchar_t *)
                    local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pwVar34 = (wchar_t *)
                    local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)pwVar34;
        local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)pwVar41;
        pwVar32 = (wchar_t *)0x0;
        pwVar34 = (wchar_t *)0x0;
      }
LAB_00222b55:
      if (pwVar34 != (wchar_t *)0x0) {
        operator_delete(pwVar34,(long)pwVar32 - (long)pwVar34);
      }
      pbVar40 = pbVar40 + 1;
    } while (pbVar40 != local_48);
  }
  local_1a8._M_dataplus._M_p = (pointer)0x0;
  local_1a8._M_string_length = 0;
  local_1a8.field_2._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1a8,
            (long)local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3);
  puVar8 = local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar37 = 0;
    pwVar32 = (wchar_t *)
              local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      llama_vocab::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_1a8);
      uVar25 = *(unsigned_long *)pwVar32 + uVar37;
      uVar35 = uVar37;
      if (uVar37 < uVar25) {
        do {
          unicode_cpt_to_utf8_abi_cxx11_
                    ((string *)local_138,
                     local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar35]);
          std::__cxx11::string::_M_append
                    ((char *)(local_1a8._M_string_length + -0x20),local_138._0_8_);
          if (local_138._0_8_ != (long)local_138 + 0x10) {
            operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
          }
          uVar35 = uVar35 + 1;
          uVar25 = *(unsigned_long *)pwVar32 + uVar37;
        } while (uVar35 < uVar25);
      }
      pwVar32 = pwVar32 + 2;
      uVar37 = uVar25;
    } while (pwVar32 != (wchar_t *)puVar8);
  }
  *(undefined8 *)local_140 = 0;
  *(pointer *)(local_140 + 8) = (pointer)0x0;
  *(pointer *)(local_140 + 0x10) = (pointer)0x0;
  local_1d8 = (string *)local_1a8._M_string_length;
  if (local_1a8._M_dataplus._M_p != (pointer)local_1a8._M_string_length) {
    _Var33._M_p = local_1a8._M_dataplus._M_p;
    do {
      local_138._0_8_ = (long)local_138 + 0x10;
      pwVar32 = (wchar_t *)(local_278 + 0x10);
      local_138._8_8_ = (pointer)0x0;
      local_138._16_8_ = local_138._16_8_ & 0xffffffffffffff00;
      unicode_cpts_from_utf8
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1d0,
                 (string *)_Var33._M_p);
      if (local_1d0.
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_1d0.
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar37 = 0;
        do {
          unicode_cpt_to_utf8_abi_cxx11_
                    ((string *)local_278,
                     *(uint32_t *)
                      ((long)&((local_1d0.
                                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_pair<const_char_*,_const_char_*>).first + uVar37 * 4));
          std::__cxx11::string::_M_append(local_138,local_278._0_8_);
          if ((wchar_t *)local_278._0_8_ != pwVar32) {
            operator_delete((void *)local_278._0_8_,CONCAT44(local_278._20_4_,local_278._16_4_) + 1)
            ;
          }
          uVar37 = uVar37 + 1;
        } while (uVar37 < (ulong)((long)local_1d0.
                                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_1d0.
                                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 2));
      }
      uVar10 = local_138._8_8_;
      local_278._8_4_ = 0;
      local_278._12_4_ = 0;
      local_278._16_4_ = local_278._16_4_ & 0xffffff00;
      local_278._0_8_ = pwVar32;
      if ((pointer)local_138._8_8_ != (pointer)0x0) {
        puVar36 = (pointer)0x0;
        do {
          unicode_byte_to_utf8_abi_cxx11_(in_stack_fffffffffffffd7f);
          std::__cxx11::string::_M_append((char *)local_278,local_220._0_8_);
          if (local_220._0_8_ != (long)&local_220 + 0x10U) {
            operator_delete((void *)local_220._0_8_,
                            (ulong)((long)&((local_220._M_automaton.
                                             super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->super__NFA_base)._M_paren_stack.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 1));
          }
          puVar36 = (pointer)((long)puVar36 + 1);
        } while ((pointer)uVar10 != puVar36);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>(local_140,(string *)local_278);
      if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
        operator_delete((void *)local_278._0_8_,CONCAT44(local_278._20_4_,local_278._16_4_) + 1);
      }
      if (local_1d0.
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1d0.
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1d0.
                              super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1d0.
                              super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_138._0_8_ != (long)local_138 + 0x10) {
        operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
      }
      _Var33._M_p = _Var33._M_p + 0x20;
    } while ((string *)_Var33._M_p != local_1d8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1a8);
  if ((wchar_t *)
      local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (wchar_t *)0x0) {
    operator_delete(local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  if (local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_140;
LAB_00221fc3:
  pwVar32 = (wchar_t *)((long)local_1d8 + 8);
  uVar37 = uVar25;
  if (pwVar32 == local_1b0) goto LAB_00221fe0;
  goto LAB_00221b7e;
LAB_00221afa:
  pwVar32 = local_38 + 2;
  psVar38 = (string *)pwVar41;
  if (pwVar32 == local_40) goto LAB_00221fe0;
  goto LAB_002214af;
}

Assistant:

std::vector<std::string> unicode_regex_split(const std::string & text, const std::vector<std::string> & regex_exprs) {
    // unicode categories
    static const std::map<std::string, int> k_ucat_enum = {
        { "\\p{N}", unicode_cpt_flags::NUMBER },
        { "\\p{L}", unicode_cpt_flags::LETTER },
        { "\\p{P}", unicode_cpt_flags::PUNCTUATION },
        { "\\p{M}", unicode_cpt_flags::ACCENT_MARK },
        { "\\p{S}", unicode_cpt_flags::SYMBOL },
    };

    static const std::map<int, int> k_ucat_cpt = {
        { unicode_cpt_flags::NUMBER,      0xD1 },
        { unicode_cpt_flags::LETTER,      0xD2 },
        { unicode_cpt_flags::PUNCTUATION, 0xD3 },
        { unicode_cpt_flags::ACCENT_MARK, 0xD4 },
        { unicode_cpt_flags::SYMBOL,      0xD5 },
    };

    static const std::map<int, std::string> k_ucat_map = {
        { unicode_cpt_flags::NUMBER,      "\x30-\x39" }, // 0-9
        { unicode_cpt_flags::LETTER,      "\x41-\x5A\x61-\x7A" }, // A-Za-z
        { unicode_cpt_flags::PUNCTUATION, "\x21-\x23\x25-\x2A\x2C-\x2F\x3A-\x3B\x3F-\x40\\\x5B-\\\x5D\x5F\\\x7B\\\x7D" }, // !-#%-*,-/:-;?-@\[-\]_\{\}
        { unicode_cpt_flags::ACCENT_MARK, "" }, // no sub-128 codepoints
        { unicode_cpt_flags::SYMBOL,      "\\\x24\\\x2B\x3C-\x3E\x5E\x60\\\x7C" }, // $+<=>^`|
    };

    // compute collapsed codepoints only if needed by at least one regex
    bool need_collapse = false;
    for (const auto & regex_expr : regex_exprs) {
        // search for unicode categories
        for (const auto & ucat : k_ucat_enum) {
            if (std::string::npos != regex_expr.find(ucat.first)) {
                need_collapse = true;
                break;
            }
        }
    }

    const auto cpts = unicode_cpts_from_utf8(text);

    // generate a "collapsed" representation of the text, where all codepoints are replaced by a single byte
    // ref: https://github.com/ggml-org/llama.cpp/pull/6920#issuecomment-2081479935
    std::string text_collapsed;
    if (need_collapse) {
        // collapse all unicode categories
        text_collapsed.resize(cpts.size());

        for (size_t i = 0; i < cpts.size(); ++i) {
            // keep single-byte codepoints as is
            if (cpts[i] < 128) {
                text_collapsed[i] = cpts[i];
                continue;
            }

            const auto flags = unicode_cpt_flags_from_cpt(cpts[i]);

            if (flags.is_whitespace) {
                //NOTE: C++ std::regex \s does not mach 0x85, Rust and Python regex does.
                //text_collapsed[i] = (char) 0x85;  // <Next Line> as whitespace fallback
                text_collapsed[i] = (char) 0x0B;    // <vertical tab> as whitespace fallback
            } else if (k_ucat_cpt.find(flags.category_flag()) != k_ucat_cpt.end()) {
                text_collapsed[i] = k_ucat_cpt.at(flags.category_flag());
            } else {
                text_collapsed[i] = (char) 0xD0; // fallback
            }
        }
    }

    std::vector<size_t> bpe_offsets = { cpts.size() };

    for (const auto & regex_expr : regex_exprs) {
        // first, see if we have an efficient custom regex implementation
        auto tmp = unicode_regex_split_custom(text, regex_expr, bpe_offsets);

        if (!tmp.empty()) {
            bpe_offsets = std::move(tmp);
            continue;
        }

        // fallback to general-purpose std::regex / std::wregex
        try {
            // if a unicode category is used in the regex, we use the collapsed text and replace the unicode category
            // with the corresponding collapsed representation
            bool use_collapsed = false;
            for (const auto & ucat : k_ucat_enum) {
                if (std::string::npos != regex_expr.find(ucat.first)) {
                    use_collapsed = true;
                    break;
                }
            }

            if (use_collapsed) {
                // sanity-check that the original regex does not contain any non-ASCII characters
                const auto cpts_regex = unicode_cpts_from_utf8(regex_expr);
                for (size_t i = 0; i < cpts_regex.size(); ++i) {
                    if (cpts_regex[i] >= 128) {
                        throw std::runtime_error("Regex includes both unicode categories and non-ASCII characters - not supported");
                    }
                }

                // generate a collapsed representation of the regex
                std::string regex_expr_collapsed;

                // track if we are inside [], because nested [] are not allowed
                bool inside = false;
                for (size_t i = 0; i < regex_expr.size(); ++i) {
                    if (regex_expr[i] == '[' && (i == 0 || regex_expr[i - 1] != '\\')) {
                        regex_expr_collapsed += '[';
                        inside = true;
                        continue;
                    }

                    if (inside && regex_expr[i] == ']' && regex_expr[i - 1] != '\\') {
                        regex_expr_collapsed += ']';
                        inside = false;
                        continue;
                    }

                    if (regex_expr[i + 0] == '\\' && i + 4 < regex_expr.size() &&
                        regex_expr[i + 1] == 'p' &&
                        regex_expr[i + 2] == '{' &&
                        regex_expr[i + 4] == '}') {
                        const std::string pat = regex_expr.substr(i, 5);
                        if (k_ucat_enum.find(pat) != k_ucat_enum.end()) {
                            if (!inside) {
                                regex_expr_collapsed += '[';
                            }
                            regex_expr_collapsed += k_ucat_cpt.at(k_ucat_enum.at(pat));
                            regex_expr_collapsed += k_ucat_map.at(k_ucat_enum.at(pat));
                            if (!inside) {
                                regex_expr_collapsed += ']';
                            }
                            i += 4;
                            continue;
                        }
                    }

                    regex_expr_collapsed += regex_expr[i];
                }

                //printf("text_collapsed: %s\n", text_collapsed.c_str());
                //printf("regex_expr_collapsed: %s\n", regex_expr_collapsed.c_str());
                bpe_offsets = unicode_regex_split_stl(text_collapsed, regex_expr_collapsed, bpe_offsets);
            } else {
                // no unicode category used, we can use std::wregex directly
                const std::wstring wregex_expr = unicode_wstring_from_utf8(regex_expr);

                // std::wregex \s does not mach non-ASCII whitespaces, using 0x0B as fallback
                std::wstring wtext(cpts.begin(), cpts.end());
                for (size_t i = 0; i < wtext.size(); ++i) {
                    if (wtext[i] > 0x7F && unicode_cpt_flags_from_cpt(wtext[i]).is_whitespace) {
                        wtext[i] = 0x0B;
                    }
                }

                //printf("text: %s\n", text.c_str());
                //printf("regex_expr: %s\n", regex_expr.c_str());
                bpe_offsets = unicode_regex_split_stl(wtext, wregex_expr, bpe_offsets);
            }
        } catch (std::regex_error & e) {
            fprintf(stderr, "Failed to process regex: '%s'\n", regex_expr.c_str());
            fprintf(stderr, "Regex error: %s\n", e.what());
            throw std::runtime_error("Failed to process regex");
        }
    }

    std::vector<std::string> bpe_words;
    bpe_words.reserve(bpe_offsets.size()); // reserve memory for the approximate size

    size_t start = 0;
    for (size_t & offset : bpe_offsets) {
        bpe_words.emplace_back();
        for (size_t i = start; i < start + offset; ++i) {
            bpe_words.back() += unicode_cpt_to_utf8(cpts[i]);
        }
        start += offset;
    }

    return unicode_byte_encoding_process(bpe_words);
}